

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.hpp
# Opt level: O0

void __thiscall
glu::sl::ShaderCaseSpecification::ShaderCaseSpecification(ShaderCaseSpecification *this)

{
  ShaderCaseSpecification *this_local;
  
  this->caseType = CASETYPE_LAST;
  this->expectResult = EXPECT_LAST;
  this->targetVersion = GLSL_VERSION_LAST;
  std::vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>::vector
            (&this->requiredCaps);
  this->fullGLSLES100Required = false;
  ValueBlock::ValueBlock(&this->values);
  std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::vector
            (&this->programs);
  return;
}

Assistant:

ShaderCaseSpecification (void)
		: caseType				(CASETYPE_LAST)
		, expectResult			(EXPECT_LAST)
		, targetVersion			(glu::GLSL_VERSION_LAST)
		, fullGLSLES100Required	(false)
	{
	}